

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_count_shift.hpp
# Opt level: O2

void __thiscall trng::lcg64_count_shift::jump2(lcg64_count_shift *this,uint s)

{
  long extraout_RAX;
  result_type rVar1;
  result_type a;
  result_type rVar2;
  ulong uVar3;
  ulong uVar4;
  uint i;
  uint uVar5;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  rVar2 = (this->S).r;
  a = 1;
  pow(in_XMM0_Qa,in_XMM1_Qa);
  rVar1 = f(1L << ((byte)s & 0x3f),(this->P).a);
  (this->S).r = rVar1 * (this->P).b + extraout_RAX * rVar2;
  for (uVar5 = 1; uVar5 <= s; uVar5 = uVar5 + 1) {
    a = mult_modulo(2,a);
  }
  rVar2 = mult_modulo(a,(this->P).inc);
  uVar3 = rVar2 + (this->S).count;
  uVar4 = uVar3 + 0xe000000000000001;
  if (uVar3 < 0x1fffffffffffffff) {
    uVar4 = uVar3;
  }
  (this->S).count = uVar4;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64_count_shift::jump2(unsigned int s) {
    // LCG part
    S.r = S.r * pow(P.a, 1ull << s) + f(1ull << s, P.a) * P.b;
    // counting part
    result_type powers_of_2{1};
    for (unsigned int i{1}; i <= s; ++i)
      powers_of_2 = mult_modulo(2, powers_of_2);
    S.count += mult_modulo(powers_of_2, P.inc);
    if (S.count >= modulus)
      S.count -= modulus;
  }